

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::prepare_insert(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *this,size_t hash)

{
  bool bVar1;
  ctrl_t h;
  size_t *psVar2;
  byte local_39;
  undefined1 local_28 [8];
  FindInfo target;
  size_t hash_local;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_local;
  
  _local_28 = find_first_non_full(this,hash);
  psVar2 = growth_left(this);
  local_39 = 0;
  if (*psVar2 == 0) {
    bVar1 = IsDeleted(this->ctrl_[(long)local_28]);
    local_39 = bVar1 ^ 0xff;
  }
  if ((local_39 & 1) != 0) {
    rehash_and_grow_if_necessary(this);
    _local_28 = find_first_non_full(this,hash);
  }
  this->size_ = this->size_ + 1;
  bVar1 = IsEmpty(this->ctrl_[(long)local_28]);
  psVar2 = growth_left(this);
  *psVar2 = *psVar2 - (ulong)bVar1;
  h = H2(hash);
  set_ctrl(this,(size_t)local_28,h);
  HashtablezInfoHandle::RecordInsert((HashtablezInfoHandle *)&this->field_0x20,hash,target.offset);
  return (size_t)local_28;
}

Assistant:

size_t prepare_insert(size_t hash) PHMAP_ATTRIBUTE_NOINLINE {
        auto target = find_first_non_full(hash);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hash);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        set_ctrl(target.offset, H2(hash));
        infoz_.RecordInsert(hash, target.probe_length);
        return target.offset;
    }